

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O1

QString * QBenchmarkValgrindUtils::getNewestFileName(void)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long lVar4;
  QChar QVar5;
  int iVar6;
  long lVar7;
  QString *in_RDI;
  QFileInfo *pQVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QAnyStringView QVar10;
  QByteArrayView QVar11;
  QAnyStringView QVar12;
  QStringView QVar13;
  bool ok;
  QRegularExpressionMatch match;
  QRegularExpression rx;
  QFileInfo lastFileInfo;
  bool local_c9;
  undefined1 *local_c8;
  undefined1 *local_c0;
  QArrayData *local_b8;
  storage_type_conflict *local_b0;
  qsizetype local_a8;
  undefined1 *local_a0;
  QString local_98;
  QArrayDataPointer<QFileInfo> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  pQVar1 = &((QBenchmarkGlobalData::current->callgrindOutFileBase).d.d)->super_QArrayData;
  pcVar2 = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.ptr;
  qVar3 = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar9.m_data = (storage_type *)0x4;
  QVar9.m_size = (qsizetype)&local_98;
  QString::fromLatin1(QVar9);
  QVar10.m_size = (size_t)&local_98;
  QVar10.field_0.m_data = &local_78;
  QVar5.ucs = (char16_t)qVar3;
  iVar6 = (int)pcVar2;
  QString::arg_impl(QVar10,iVar6,QVar5);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_58,local_58.size,(QString *)&local_78);
  QList<QString>::end((QList<QString> *)&local_58);
  if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QFileInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  local_98.d.size = 0;
  QDir::QDir((QDir *)&local_b8,&local_98);
  QDir::entryInfoList(&local_78,&local_b8,&local_58,0x12,0xffffffff);
  QDir::~QDir((QDir *)&local_b8);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo((QFileInfo *)&local_a0);
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QVar11.m_data = (storage_type *)0x8;
  QVar11.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar11);
  QVar12.m_size = (size_t)&local_b8;
  QVar12.field_0.m_data = &local_98;
  QString::arg_impl(QVar12,iVar6,QVar5);
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8,2,0x10);
    }
  }
  local_c0 = &DAT_aaaaaaaaaaaaaaaa;
  QRegularExpression::QRegularExpression((QRegularExpression *)&local_c0,&local_98,0);
  if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
    lVar7 = local_78.size << 3;
    iVar6 = -1;
    pQVar8 = local_78.ptr;
    do {
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      QFileInfo::fileName();
      QRegularExpression::match((QRegularExpressionMatch *)&local_c8,&local_c0,&local_b8,0,0,0);
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b8,2,0x10);
        }
      }
      local_c9 = true;
      QRegularExpressionMatch::captured((int)&local_b8);
      QVar13.m_data = local_b0;
      QVar13.m_size = local_a8;
      lVar4 = QString::toIntegral_helper(QVar13,&local_c9,10);
      if ((int)lVar4 != lVar4) {
        local_c9 = false;
        lVar4 = 0;
      }
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b8,2,0x10);
        }
      }
      if (iVar6 < (int)lVar4) {
        QFileInfo::operator=((QFileInfo *)&local_a0,pQVar8);
        iVar6 = (int)lVar4;
      }
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_c8);
      pQVar8 = pQVar8 + 8;
      lVar7 = lVar7 + -8;
    } while (lVar7 != 0);
  }
  QFileInfo::fileName();
  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_c0);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_a0);
  QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_78);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QBenchmarkValgrindUtils::getNewestFileName()
{
    QStringList nameFilters;
    QString base = QBenchmarkGlobalData::current->callgrindOutFileBase;
    Q_ASSERT(!base.isEmpty());

    nameFilters << QString::fromLatin1("%1.*").arg(base);
    const QFileInfoList fiList = QDir().entryInfoList(nameFilters, QDir::Files | QDir::Readable);
    Q_ASSERT(!fiList.empty());
    int hiSuffix = -1;
    QFileInfo lastFileInfo;
    const QString pattern = QString::fromLatin1("%1.(\\d+)").arg(base);
    QRegularExpression rx(pattern);
    for (const QFileInfo &fileInfo : fiList) {
        QRegularExpressionMatch match = rx.match(fileInfo.fileName());
        Q_ASSERT(match.hasMatch());
        bool ok;
        const int suffix = match.captured(1).toInt(&ok);
        Q_ASSERT(ok);
        Q_ASSERT(suffix >= 0);
        if (suffix > hiSuffix) {
            lastFileInfo = fileInfo;
            hiSuffix = suffix;
        }
    }

    return lastFileInfo.fileName();
}